

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

bool __thiscall
rlottie::internal::renderer::GradientStroke::updateContent
          (GradientStroke *this,int frameNo,VMatrix *matrix,float alpha)

{
  Drawable *this_00;
  vector<float,_std::allocator<float>_> *result;
  float fVar1;
  CapStyle cap;
  JoinStyle join;
  GradientStroke *pGVar2;
  VGradient *pVVar3;
  pointer pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float *elm;
  long lVar9;
  pointer pfVar10;
  VMatrix *this_01;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 local_48 [8];
  anon_union_8_3_adf75f03_for_VBrush_2 aStack_40;
  VPointF local_38;
  
  pGVar2 = this->mData;
  if ((pGVar2->super_Gradient).mOpacity.isValue_ == true) {
    fVar12 = (pGVar2->super_Gradient).mOpacity.impl_.value_;
  }
  else {
    fVar12 = model::KeyFrames<float,_void>::value((pGVar2->super_Gradient).mOpacity.impl_,frameNo);
  }
  fVar11 = (fVar12 / 100.0) * alpha;
  model::Gradient::update(&this->mData->super_Gradient,&this->mGradient,frameNo);
  pVVar3 = (this->mGradient)._M_t.super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>.
           _M_t.super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
           super__Head_base<0UL,_VGradient_*,_false>._M_head_impl;
  pVVar3->mAlpha = fVar11;
  fVar12 = matrix->m12;
  fVar1 = matrix->m13;
  fVar13 = matrix->m21;
  fVar5 = matrix->m22;
  fVar6 = matrix->m23;
  fVar7 = matrix->mtx;
  fVar8 = matrix->mty;
  (pVVar3->mMatrix).m11 = matrix->m11;
  (pVVar3->mMatrix).m12 = fVar12;
  (pVVar3->mMatrix).m13 = fVar1;
  (pVVar3->mMatrix).m21 = fVar13;
  (pVVar3->mMatrix).m22 = fVar5;
  (pVVar3->mMatrix).m23 = fVar6;
  (pVVar3->mMatrix).mtx = fVar7;
  (pVVar3->mMatrix).mty = fVar8;
  *(undefined8 *)((long)&(pVVar3->mMatrix).mty + 2) = *(undefined8 *)((long)&matrix->mty + 2);
  this_01 = &((this->mGradient)._M_t.
              super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>._M_t.
              super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
              super__Head_base<0UL,_VGradient_*,_false>._M_head_impl)->mMatrix;
  local_48._0_4_ = 0.0;
  local_48._4_4_ = 0.0;
  local_38.mx = 1.41421;
  local_38.my = 1.41421;
  local_48 = (undefined1  [8])VMatrix::map(this_01,(VPointF *)local_48);
  local_38 = VMatrix::map(this_01,&local_38);
  fVar12 = (local_38.mx - (float)local_48._0_4_) * (local_38.mx - (float)local_48._0_4_) +
           (local_38.my - (float)local_48._4_4_) * (local_38.my - (float)local_48._4_4_);
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  this_00 = &(this->super_Paint).mDrawable;
  VBrush::VBrush((VBrush *)local_48,
                 (this->mGradient)._M_t.
                 super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>._M_t.
                 super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
                 super__Head_base<0UL,_VGradient_*,_false>._M_head_impl);
  *(undefined1 (*) [8])&(this->super_Paint).mDrawable.super_VDrawable.mBrush = local_48;
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.field_1 = aStack_40;
  pGVar2 = this->mData;
  cap = pGVar2->mCapStyle;
  join = pGVar2->mJoinStyle;
  fVar1 = pGVar2->mMiterLimit;
  if ((pGVar2->mWidth).isValue_ == true) {
    fVar13 = (pGVar2->mWidth).impl_.value_;
  }
  else {
    fVar13 = model::KeyFrames<float,_void>::value((pGVar2->mWidth).impl_,frameNo);
  }
  VDrawable::setStrokeInfo(&this_00->super_VDrawable,cap,join,fVar1,fVar13 * fVar12 * 0.5);
  if ((this->mData->mDash).mData.
      super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->mData->mDash).mData.
      super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar9 = __tls_get_addr(&PTR_00145f70);
    if (*(char *)(lVar9 + 0x58) == '\0') {
      updateContent();
    }
    result = (vector<float,_std::allocator<float>_> *)(lVar9 + 0x40);
    pfVar10 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (*(pointer *)(lVar9 + 0x48) != pfVar10) {
      *(pointer *)(lVar9 + 0x48) = pfVar10;
    }
    pGVar2 = this->mData;
    if (*(char *)(lVar9 + 0x58) == '\0') {
      updateContent();
    }
    model::Dash::getDashInfo(&pGVar2->mDash,frameNo,result);
    if (*(char *)(lVar9 + 0x58) == '\0') {
      updateContent();
    }
    if ((result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start != *(pointer *)(lVar9 + 0x48)) {
      if (*(char *)(lVar9 + 0x58) == '\0') {
        updateContent();
      }
      pfVar4 = *(pointer *)(lVar9 + 0x48);
      for (pfVar10 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start; pfVar10 != pfVar4; pfVar10 = pfVar10 + 1) {
        *pfVar10 = *pfVar10 * fVar12 * 0.5;
      }
      if (*(char *)(lVar9 + 0x58) == '\0') {
        updateContent();
      }
      VDrawable::setDashInfo(&this_00->super_VDrawable,result);
    }
  }
  return 1e-06 < ABS(fVar11);
}

Assistant:

bool renderer::GradientStroke::updateContent(int frameNo, const VMatrix &matrix,
                                             float alpha)
{
    float combinedAlpha = alpha * mData->opacity(frameNo);

    mData->update(mGradient, frameNo);
    mGradient->setAlpha(combinedAlpha);
    mGradient->mMatrix = matrix;
    auto scale = mGradient->mMatrix.scale();
    mDrawable.setBrush(VBrush(mGradient.get()));
    mDrawable.setStrokeInfo(mData->capStyle(), mData->joinStyle(),
                            mData->miterLimit(), mData->width(frameNo) * scale);

    if (mData->hasDashInfo()) {
        Dash_Vector.clear();
        mData->getDashInfo(frameNo, Dash_Vector);
        if (!Dash_Vector.empty()) {
            for (auto &elm : Dash_Vector) elm *= scale;
            mDrawable.setDashInfo(Dash_Vector);
        }
    }

    return !vIsZero(combinedAlpha);
}